

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O3

bool __thiscall cmGraphVizWriter::ItemNameFilteredOut(cmGraphVizWriter *this,string *itemName)

{
  pointer pRVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  RegularExpression *regEx;
  pointer this_00;
  
  iVar4 = std::__cxx11::string::compare((char *)itemName);
  bVar3 = true;
  if ((iVar4 != 0) && (bVar2 = cmGlobalGenerator::IsReservedTarget(itemName), !bVar2)) {
    pRVar1 = (this->TargetsToIgnoreRegex).
             super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (this_00 = (this->TargetsToIgnoreRegex).
                   super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                   ._M_impl.super__Vector_impl_data._M_start; this_00 != pRVar1;
        this_00 = this_00 + 1) {
      if ((this_00->program != (char *)0x0) &&
         (bVar3 = cmsys::RegularExpression::find
                            (this_00,(itemName->_M_dataplus)._M_p,&this_00->regmatch), bVar3)) {
        return true;
      }
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool cmGraphVizWriter::ItemNameFilteredOut(std::string const& itemName)
{
  if (itemName == ">") {
    // FIXME: why do we even receive such a target here?
    return true;
  }

  if (cmGlobalGenerator::IsReservedTarget(itemName)) {
    return true;
  }

  for (cmsys::RegularExpression& regEx : this->TargetsToIgnoreRegex) {
    if (regEx.is_valid()) {
      if (regEx.find(itemName)) {
        return true;
      }
    }
  }

  return false;
}